

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O1

void __thiscall dg::vr::ValueRelations::areMerged(ValueRelations *this,Handle to,Handle from)

{
  BucketToVals *this_00;
  iterator iVar1;
  iterator iVar2;
  Handle pBVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
  pVar4;
  VectorSet<const_llvm::Value_*> fromVals;
  key_type local_50;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> local_48;
  
  this_00 = &this->bucketToVals;
  local_48.super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)to;
  iVar1 = std::
          _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
          ::find(&this_00->_M_t,(key_type *)&local_48);
  local_50._M_data = from;
  iVar2 = std::
          _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
          ::find(&this_00->_M_t,&local_50);
  std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::vector
            (&local_48,
             (vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)
             &iVar2._M_node[1]._M_parent);
  if (local_48.super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl
      .super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    pBVar3 = (Handle)local_48.
                     super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
    do {
      add(this,(V)pBVar3->id,to,(VectorSet<const_llvm::Value_*> *)&iVar1._M_node[1]._M_parent);
      pBVar3 = (Handle)&pBVar3->relatedBuckets;
    } while (pBVar3 != (Handle)local_48.
                               super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_50._M_data = from;
  pVar4 = std::
          _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
          ::equal_range(&this_00->_M_t,&local_50);
  std::
  _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
  ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar4.first._M_node,(_Base_ptr)pVar4.second._M_node);
  if ((Handle)local_48.super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
              ._M_impl.super__Vector_impl_data._M_start != (Handle)0x0) {
    operator_delete(local_48.
                    super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ValueRelations::areMerged(Handle to, Handle from) {
    VectorSet<V> &toVals = bucketToVals.find(to)->second;
    assert(bucketToVals.find(from) != bucketToVals.end());
    const VectorSet<V> fromVals = bucketToVals.find(from)->second;

    for (V val : fromVals)
        add(val, to, toVals);

    assert(bucketToVals.at(from).empty());
    bucketToVals.erase(from);
}